

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1)

{
  size_t __n;
  char *__dest;
  
  heapString(__return_storage_ptr__,(size_t)(params->ptr + *(long *)(this + 8)));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __n = *(size_t *)(this + 8);
  if (__n != 0) {
    memcpy(__dest,*(void **)this,__n);
    __dest = __dest + __n;
  }
  if (params->ptr != (char *)0x0) {
    memcpy(__dest,&params->size_,(size_t)params->ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}